

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall cubeb_individual_methods_Test::TestBody(cubeb_individual_methods_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  uint32_t frames_needed2;
  float buffer [512];
  cubeb_resampler_speex_one_way<float> one_way;
  AssertionResult gtest_ar;
  uint32_t frames_needed1;
  delay_line<float> dl;
  uint32_t frames;
  uint32_t sample_rate;
  uint32_t channels;
  int in_stack_0000f6f0;
  uint32_t in_stack_0000f6f4;
  uint32_t in_stack_0000f6f8;
  uint32_t in_stack_0000f6fc;
  cubeb_resampler_speex_one_way<float> *in_stack_0000f700;
  AssertHelper AStack_928;
  undefined4 in_stack_fffffffffffff6e0;
  uint32_t in_stack_fffffffffffff6e4;
  uint in_stack_fffffffffffff6e8;
  uint32_t in_stack_fffffffffffff6ec;
  undefined4 in_stack_fffffffffffff6f0;
  int32_t in_stack_fffffffffffff6f4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff6f8;
  undefined1 local_8f8 [2148];
  uint local_94;
  AssertHelper local_90;
  Message local_88;
  undefined4 local_7c;
  AssertionResult local_78;
  uint32_t local_64;
  delay_line<float> local_60;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 2;
  local_10 = 0xac44;
  local_14 = 0x100;
  delay_line<float>::delay_line
            ((delay_line<float> *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
             in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8,in_stack_fffffffffffff6e4);
  local_64 = delay_line<float>::input_needed_for_output(&local_60,0);
  local_7c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)in_stack_fffffffffffff6f8.ptr_,
             (char *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
             (uint *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
             (uint *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_78);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10d1c7);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x434,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x10d217);
  }
  local_94 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d23c);
  if (local_94 == 0) {
    cubeb_resampler_speex_one_way<float>::cubeb_resampler_speex_one_way
              (in_stack_0000f700,in_stack_0000f6fc,in_stack_0000f6f8,in_stack_0000f6f4,
               in_stack_0000f6f0);
    memset(local_8f8,0,0x800);
    cubeb_resampler_speex_one_way<float>::input
              ((cubeb_resampler_speex_one_way<float> *)
               CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
               (float *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
               CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    cubeb_resampler_speex_one_way<float>::input_needed_for_output
              ((cubeb_resampler_speex_one_way<float> *)in_stack_fffffffffffff6f8.ptr_,
               in_stack_fffffffffffff6f4);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((char *)in_stack_fffffffffffff6f8.ptr_,
               (char *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
               (uint *)(ulong)in_stack_fffffffffffff6e8,
               (uint *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffff6f0);
    if (!bVar1) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10d2f7);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_928,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                 ,0x43c,pcVar2);
      testing::internal::AssertHelper::operator=(&AStack_928,(Message *)&stack0xfffffffffffff6e0);
      testing::internal::AssertHelper::~AssertHelper(&AStack_928);
      testing::Message::~Message((Message *)0x10d332);
    }
    local_94 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d354);
    if (local_94 == 0) {
      local_94 = 0;
    }
    cubeb_resampler_speex_one_way<float>::~cubeb_resampler_speex_one_way
              ((cubeb_resampler_speex_one_way<float> *)
               CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  }
  delay_line<float>::~delay_line
            ((delay_line<float> *)CONCAT44(in_stack_fffffffffffff6e4,in_stack_fffffffffffff6e0));
  return;
}

Assistant:

TEST(cubeb, individual_methods) {
  const uint32_t channels = 2;
  const uint32_t sample_rate = 44100;
  const uint32_t frames = 256;

  delay_line<float> dl(10, channels, sample_rate);
  uint32_t frames_needed1 = dl.input_needed_for_output(0);
  ASSERT_EQ(frames_needed1, 0u);

  cubeb_resampler_speex_one_way<float> one_way(channels, sample_rate, sample_rate, CUBEB_RESAMPLER_QUALITY_DEFAULT);
  float buffer[channels * frames] = {0.0};
  // Add all frames in the resampler's internal buffer.
  one_way.input(buffer, frames);
  // Ask for less than the existing frames, this would create a uint overlflow without the fix.
  uint32_t frames_needed2 = one_way.input_needed_for_output(0);
  ASSERT_EQ(frames_needed2, 0u);
}